

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall QDirPrivate::clearCache(QDirPrivate *this,MetaDataClearing mode)

{
  int in_ESI;
  QFileSystemMetaData *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 __i;
  unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *puVar1;
  QFileSystemMetaData *data;
  _Head_base<0UL,_QAbstractFileEngine_*,_false> in_stack_ffffffffffffffe8;
  QMutexLocker<QMutex> local_9;
  long local_8;
  
  __i = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = (QMutexLocker<QMutex>)0xaa;
  data = in_RDI;
  QMutexLocker<QMutex>::QMutexLocker(&local_9,(QMutex *)&in_RDI[1].userId_);
  if (in_ESI == 1) {
    QFileSystemMetaData::clear(in_RDI);
  }
  std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)__i);
  QList<QString>::clear((QList<QString> *)in_RDI);
  QList<QFileInfo>::clear((QList<QFileInfo> *)in_RDI);
  puVar1 = (unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
           &stack0xffffffffffffffe8;
  QFileSystemEngine::createLegacyEngine
            ((QFileSystemEntry *)in_stack_ffffffffffffffe8._M_head_impl,data);
  std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator=
            ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)in_RDI,
             puVar1);
  std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::~unique_ptr
            ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)in_RDI);
  QMutexLocker<QMutex>::~QMutexLocker(&local_9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QDirPrivate::clearCache(MetaDataClearing mode)
{
    QMutexLocker locker(&fileCache.mutex);
    if (mode == IncludingMetaData)
        fileCache.metaData.clear();
    fileCache.fileListsInitialized = false;
    fileCache.files.clear();
    fileCache.fileInfos.clear();
    fileEngine = QFileSystemEngine::createLegacyEngine(dirEntry, fileCache.metaData);
}